

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

SocketPeerInfo * sk_net_peer_info(Socket *sock)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  SocketPeerInfo *ptr;
  char *pcVar4;
  passwd *ppVar5;
  group *pgVar6;
  char *pcVar7;
  int gid;
  int uid;
  int pid;
  socklen_t addrlen;
  sockaddr_union addr;
  char buf [46];
  char gidbuf [64];
  uint local_138;
  uint local_134;
  uint local_130;
  socklen_t local_12c;
  undefined1 local_128 [8];
  char local_120 [8];
  undefined8 uStack_118;
  char local_a8 [64];
  char local_68 [72];
  
  local_12c = 0x80;
  iVar3 = getpeername(*(int *)&sock[-0x11].vt,(sockaddr *)local_128,&local_12c);
  if (iVar3 < 0) {
LAB_00147b79:
    ptr = (SocketPeerInfo *)0x0;
  }
  else {
    ptr = (SocketPeerInfo *)safemalloc(1,0x30,0);
    ptr->addressfamily = 0;
    ptr->addr_text = (char *)0x0;
    ptr->port = -1;
    ptr->log_text = (char *)0x0;
    if (local_128._0_2_ == 1) {
      ptr->addressfamily = 3;
      _Var2 = so_peercred(*(int *)&sock[-0x11].vt,(int *)&local_130,(int *)&local_134,
                          (int *)&local_138);
      if (!_Var2) {
        return ptr;
      }
      pcVar4 = local_a8;
      sprintf(pcVar4,"%d",(ulong)local_134);
      pcVar7 = local_68;
      sprintf(pcVar7,"%d",(ulong)local_138);
      ppVar5 = getpwuid(local_134);
      pgVar6 = getgrgid(local_138);
      if (ppVar5 != (passwd *)0x0) {
        pcVar4 = ppVar5->pw_name;
      }
      if (pgVar6 != (group *)0x0) {
        pcVar7 = pgVar6->gr_name;
      }
      pcVar4 = dupprintf("pid %d (%s:%s)",(ulong)local_130,pcVar4,pcVar7);
    }
    else {
      if (local_128._0_2_ == 10) {
        ptr->addressfamily = 2;
        *(char (*) [8])&ptr->addr_bin = local_120;
        *(undefined8 *)((long)&ptr->addr_bin + 8) = uStack_118;
        ptr->port = (uint)(ushort)(local_128._2_2_ << 8 | (ushort)local_128._2_2_ >> 8);
        pcVar4 = inet_ntop(10,local_120,local_a8,0x2e);
        pcVar4 = dupstr(pcVar4);
        ptr->addr_text = pcVar4;
        uVar1 = ptr->port;
        pcVar7 = "[%s]:%d";
      }
      else {
        if (local_128._0_2_ != 2) {
          safefree(ptr);
          goto LAB_00147b79;
        }
        ptr->addressfamily = 1;
        *(undefined4 *)&ptr->addr_bin = local_128._4_4_;
        ptr->port = (uint)(ushort)(local_128._2_2_ << 8 | (ushort)local_128._2_2_ >> 8);
        pcVar4 = inet_ntoa((in_addr)local_128._4_4_);
        pcVar4 = dupstr(pcVar4);
        ptr->addr_text = pcVar4;
        uVar1 = ptr->port;
        pcVar7 = "%s:%d";
      }
      pcVar4 = dupprintf(pcVar7,pcVar4,(ulong)uVar1);
    }
    ptr->log_text = pcVar4;
  }
  return ptr;
}

Assistant:

static SocketPeerInfo *sk_net_peer_info(Socket *sock)
{
    NetSocket *s = container_of(sock, NetSocket, sock);
    union sockaddr_union addr;
    socklen_t addrlen = sizeof(addr);
#ifndef NO_IPV6
    char buf[INET6_ADDRSTRLEN];
#endif
    SocketPeerInfo *pi;

    if (getpeername(s->s, &addr.sa, &addrlen) < 0)
        return NULL;

    pi = snew(SocketPeerInfo);
    pi->addressfamily = ADDRTYPE_UNSPEC;
    pi->addr_text = NULL;
    pi->port = -1;
    pi->log_text = NULL;

    if (addr.storage.ss_family == AF_INET) {
        pi->addressfamily = ADDRTYPE_IPV4;
        memcpy(pi->addr_bin.ipv4, &addr.sin.sin_addr, 4);
        pi->port = ntohs(addr.sin.sin_port);
        pi->addr_text = dupstr(inet_ntoa(addr.sin.sin_addr));
        pi->log_text = dupprintf("%s:%d", pi->addr_text, pi->port);

#ifndef NO_IPV6
    } else if (addr.storage.ss_family == AF_INET6) {
        pi->addressfamily = ADDRTYPE_IPV6;
        memcpy(pi->addr_bin.ipv6, &addr.sin6.sin6_addr, 16);
        pi->port = ntohs(addr.sin6.sin6_port);
        pi->addr_text = dupstr(
            inet_ntop(AF_INET6, &addr.sin6.sin6_addr, buf, sizeof(buf)));
        pi->log_text = dupprintf("[%s]:%d", pi->addr_text, pi->port);
#endif

    } else if (addr.storage.ss_family == AF_UNIX) {
        pi->addressfamily = ADDRTYPE_LOCAL;

        /*
         * For Unix sockets, the source address is unlikely to be
         * helpful, so we leave addr_txt NULL (and we certainly can't
         * fill in port, obviously). Instead, we try SO_PEERCRED and
         * try to get the source pid, and put that in the log text.
         */
        int pid, uid, gid;
        if (so_peercred(s->s, &pid, &uid, &gid)) {
            char uidbuf[64], gidbuf[64];
            sprintf(uidbuf, "%d", uid);
            sprintf(gidbuf, "%d", gid);
            struct passwd *pw = getpwuid(uid);
            struct group *gr = getgrgid(gid);
            pi->log_text = dupprintf("pid %d (%s:%s)", pid,
                                     pw ? pw->pw_name : uidbuf,
                                     gr ? gr->gr_name : gidbuf);
        }
    } else {
        sfree(pi);
        return NULL;
    }

    return pi;
}